

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdbmp.c
# Opt level: O2

JDIMENSION preload_image(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  uint uVar1;
  jpeg_progress_mgr *pjVar2;
  JSAMPARRAY ppJVar3;
  ulong uVar4;
  
  pjVar2 = cinfo->progress;
  for (uVar4 = 0; uVar1 = cinfo->image_height, uVar4 < uVar1; uVar4 = uVar4 + 1) {
    if (pjVar2 != (jpeg_progress_mgr *)0x0) {
      pjVar2->pass_counter = uVar4;
      pjVar2->pass_limit = (ulong)uVar1;
      (*pjVar2->progress_monitor)((j_common_ptr)cinfo);
    }
    ppJVar3 = (*cinfo->mem->access_virt_sarray)
                        ((j_common_ptr)cinfo,(jvirt_sarray_ptr)sinfo[1].finish_input,
                         (JDIMENSION)uVar4,1,1);
    sinfo->buffer = ppJVar3;
    (*sinfo[2].finish_input)(cinfo,sinfo);
  }
  if (pjVar2 != (jpeg_progress_mgr *)0x0) {
    *(int *)&pjVar2[1].progress_monitor = *(int *)&pjVar2[1].progress_monitor + 1;
  }
  sinfo->get_pixel_rows = get_memory_row;
  *(undefined4 *)&sinfo[1].input_file = 0;
  get_memory_row(cinfo,sinfo);
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
preload_image(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  bmp_source_ptr source = (bmp_source_ptr)sinfo;
  register FILE *infile = source->pub.input_file;
  register JSAMPROW out_ptr;
  JSAMPARRAY image_ptr;
  JDIMENSION row;
  cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;

  /* Read the data into a virtual array in input-file row order. */
  for (row = 0; row < cinfo->image_height; row++) {
    if (progress != NULL) {
      progress->pub.pass_counter = (long)row;
      progress->pub.pass_limit = (long)cinfo->image_height;
      (*progress->pub.progress_monitor) ((j_common_ptr)cinfo);
    }
    image_ptr = (*cinfo->mem->access_virt_sarray)
      ((j_common_ptr)cinfo, source->whole_image, row, (JDIMENSION)1, TRUE);
    out_ptr = image_ptr[0];
    if (fread(out_ptr, 1, source->row_width, infile) != source->row_width) {
      if (feof(infile))
        ERREXIT(cinfo, JERR_INPUT_EOF);
      else
        ERREXIT(cinfo, JERR_FILE_READ);
    }
  }
  if (progress != NULL)
    progress->completed_extra_passes++;

  /* Set up to read from the virtual array in top-to-bottom order */
  switch (source->bits_per_pixel) {
  case 8:
    source->pub.get_pixel_rows = get_8bit_row;
    break;
  case 24:
    source->pub.get_pixel_rows = get_24bit_row;
    break;
  case 32:
    source->pub.get_pixel_rows = get_32bit_row;
    break;
  default:
    ERREXIT(cinfo, JERR_BMP_BADDEPTH);
  }
  source->source_row = cinfo->image_height;

  /* And read the first row */
  return (*source->pub.get_pixel_rows) (cinfo, sinfo);
}